

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

void __thiscall
CorUnix::CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
          (CSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,
          _WaitingThreadsListNode *pobj)

{
  USynchCacheStackNode *pNode;
  
  if (pobj != (_WaitingThreadsListNode *)0x0) {
    InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
    if ((this->m_iDepth).m_val < this->m_iMaxDepth) {
      if (this->m_iMaxTrackedDepth < (this->m_iDepth).m_val) {
        this->m_iMaxTrackedDepth = (this->m_iDepth).m_val;
      }
      pobj->ptrNext = (WTLNodeGenrPtr)(this->m_pHead).m_val;
      (this->m_pHead).m_val = (_USynchCacheStackNode *)pobj;
      (this->m_iDepth).m_val = (this->m_iDepth).m_val + 1;
    }
    else {
      InternalFree(pobj);
    }
    InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
    return;
  }
  return;
}

Assistant:

void Add(CPalThread * pthrCurrent, T * pobj)
        {
            USynchCacheStackNode * pNode = reinterpret_cast<USynchCacheStackNode *>(pobj);

            if (NULL == pobj)
            {
                return;
            }

            pobj->~T();
            
            Lock(pthrCurrent);
            if (m_iDepth < m_iMaxDepth)
            {
#ifdef _DEBUG
                if (m_iDepth > m_iMaxTrackedDepth)
                {
                    m_iMaxTrackedDepth = m_iDepth;
                }
#endif
                pNode->next = m_pHead;
                m_pHead = pNode;
                m_iDepth++;
            }
            else
            {
                InternalDelete((char *)pNode);
            }
            Unlock(pthrCurrent);
        }